

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O0

void __thiscall psy::C::SemanticModelTester::case0002(SemanticModelTester *this)

{
  DeclarationCategory DVar1;
  SymbolKind SVar2;
  bool bVar3;
  TypeKind TVar4;
  BasicTypeKind BVar5;
  int iVar6;
  DeclaratorListSyntax *pDVar7;
  undefined4 extraout_var;
  ostream *poVar8;
  void *pvVar9;
  undefined8 uVar10;
  undefined4 extraout_var_00;
  Lexeme *pLVar11;
  Type *pTVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  string local_f0;
  string local_d0;
  ObjectDeclarationSymbol *local_b0;
  VariableDeclarationSymbol *varDeclSym;
  DeclarationSymbol *declSym;
  ParenthesizedDeclaratorSyntax *parenDecltor;
  DeclaratorSyntax *decltor;
  type *semaModel;
  type *varAndOrFunDeclNode;
  string local_78 [55];
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [24];
  SemanticModelTester *this_local;
  
  local_20._16_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"int ( x ) ;",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"",(allocator<char> *)((long)&varAndOrFunDeclNode + 7));
  compile<psy::C::VariableAndOrFunctionDeclarationSyntax>
            ((SemanticModelTester *)local_20,(string *)this,&local_40);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&varAndOrFunDeclNode + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  semaModel = (type *)std::
                      get<0ul,psy::C::VariableAndOrFunctionDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                                ((tuple<const_psy::C::VariableAndOrFunctionDeclarationSyntax_*,_const_psy::C::SemanticModel_*>
                                  *)local_20);
  decltor = (DeclaratorSyntax *)
            std::
            get<1ul,psy::C::VariableAndOrFunctionDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                      ((tuple<const_psy::C::VariableAndOrFunctionDeclarationSyntax_*,_const_psy::C::SemanticModel_*>
                        *)local_20);
  pDVar7 = VariableAndOrFunctionDeclarationSyntax::declarators
                     ((VariableAndOrFunctionDeclarationSyntax *)*semaModel);
  parenDecltor = (ParenthesizedDeclaratorSyntax *)
                 (pDVar7->
                 super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                 ).
                 super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                 .value;
  iVar6 = (*(parenDecltor->super_DeclaratorSyntax).super_SyntaxNode.super_Managed._vptr_Managed
            [0x54])();
  declSym = (DeclarationSymbol *)CONCAT44(extraout_var,iVar6);
  varDeclSym = (VariableDeclarationSymbol *)
               SemanticModel::declarationBy
                         ((SemanticModel *)(decltor->super_SyntaxNode).super_Managed._vptr_Managed,
                          (DeclaratorSyntax *)declSym);
  if (varDeclSym == (VariableDeclarationSymbol *)0x0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpression is NOT ");
    poVar8 = std::operator<<(poVar8,"true");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,0x75);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  DVar1 = DeclarationSymbol::category((DeclarationSymbol *)varDeclSym);
  if (DVar1 != Object) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
    DVar1 = DeclarationSymbol::category((DeclarationSymbol *)varDeclSym);
    poVar8 = C::operator<<(poVar8,DVar1);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
    poVar8 = C::operator<<(poVar8,Object);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,0x76);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  SVar2 = Symbol::kind((Symbol *)varDeclSym);
  if (SVar2 != VariableDeclaration) {
    poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
    SVar2 = Symbol::kind((Symbol *)varDeclSym);
    poVar8 = C::operator<<(poVar8,SVar2);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
    poVar8 = C::operator<<(poVar8,VariableDeclaration);
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"\t\t");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    pvVar9 = (void *)std::ostream::operator<<(poVar8,0x77);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    uVar10 = __cxa_allocate_exception(1);
    __cxa_throw(uVar10,&TestFailed::typeinfo,0);
  }
  iVar6 = (*(varDeclSym->super_ObjectDeclarationSymbol).super_DeclarationSymbol.super_Symbol.
            _vptr_Symbol[0xd])();
  local_b0 = (ObjectDeclarationSymbol *)CONCAT44(extraout_var_00,iVar6);
  pLVar11 = &ObjectDeclarationSymbol::name(local_b0)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_d0,pLVar11);
  bVar3 = std::operator==(&local_d0,"x");
  std::__cxx11::string::~string((string *)&local_d0);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    pTVar12 = ObjectDeclarationSymbol::type(local_b0);
    TVar4 = Type::kind(pTVar12);
    if (TVar4 != Basic) {
      poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
      pTVar12 = ObjectDeclarationSymbol::type(local_b0);
      TVar4 = Type::kind(pTVar12);
      poVar8 = ::operator<<(poVar8,TVar4);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
      poVar8 = ::operator<<(poVar8,Basic);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"\t\t");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                              );
      poVar8 = std::operator<<(poVar8,":");
      pvVar9 = (void *)std::ostream::operator<<(poVar8,0x7a);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      uVar10 = __cxa_allocate_exception(1);
      __cxa_throw(uVar10,&TestFailed::typeinfo,0);
    }
    pTVar12 = ObjectDeclarationSymbol::type(local_b0);
    iVar6 = (*pTVar12->_vptr_Type[5])();
    BVar5 = BasicType::kind((BasicType *)CONCAT44(extraout_var_01,iVar6));
    if (BVar5 != Int_S) {
      poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
      pTVar12 = ObjectDeclarationSymbol::type(local_b0);
      iVar6 = (*pTVar12->_vptr_Type[5])();
      BVar5 = BasicType::kind((BasicType *)CONCAT44(extraout_var_02,iVar6));
      poVar8 = C::operator<<(poVar8,BVar5);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
      poVar8 = C::operator<<(poVar8,Int_S);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"\t\t");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                              );
      poVar8 = std::operator<<(poVar8,":");
      pvVar9 = (void *)std::ostream::operator<<(poVar8,0x7b);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      uVar10 = __cxa_allocate_exception(1);
      __cxa_throw(uVar10,&TestFailed::typeinfo,0);
    }
    return;
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
  poVar8 = std::operator<<(poVar8,"\t\tActual  : ");
  pLVar11 = &ObjectDeclarationSymbol::name(local_b0)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_f0,pLVar11);
  poVar8 = std::operator<<(poVar8,(string *)&local_f0);
  poVar8 = std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar8,"\t\tExpected: ");
  poVar8 = std::operator<<(poVar8,"x");
  poVar8 = std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar8,"\t\t");
  poVar8 = std::operator<<(poVar8,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                          );
  poVar8 = std::operator<<(poVar8,":");
  pvVar9 = (void *)std::ostream::operator<<(poVar8,0x79);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_f0);
  uVar10 = __cxa_allocate_exception(1);
  __cxa_throw(uVar10,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0002()
{
    auto [varAndOrFunDeclNode, semaModel] =
            compile<VariableAndOrFunctionDeclarationSyntax>("int ( x ) ;");

    auto decltor = varAndOrFunDeclNode->declarators()->value;
    auto parenDecltor = decltor->asParenthesizedDeclarator();
    const DeclarationSymbol* declSym = semaModel->declarationBy(parenDecltor);
    PSY_EXPECT_TRUE(declSym);
    PSY_EXPECT_EQ_ENU(declSym->category(), DeclarationCategory::Object, DeclarationCategory);
    PSY_EXPECT_EQ_ENU(declSym->kind(), SymbolKind::VariableDeclaration, SymbolKind);
    const VariableDeclarationSymbol* varDeclSym = declSym->asVariableDeclaration();
    PSY_EXPECT_EQ_STR(varDeclSym->name()->valueText(), "x");
    PSY_EXPECT_EQ_ENU(varDeclSym->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(varDeclSym->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);
}